

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitCommon.c
# Opt level: O1

void sysbvm_jit_dwarfLineInfoEmissionState_emitSourcePosition
               (sysbvm_bytecodeJit_t *jit,sysbvm_jit_dwarfLineInfoEmissionState_t *state,
               sysbvm_tuple_t sourcePosition,size_t pc,uint32_t line,uint32_t column)

{
  uint32_t file;
  long lVar1;
  
  if ((sourcePosition & 0xf) == 0 && sourcePosition != 0) {
    if (*(sysbvm_tuple_t *)(sourcePosition + 0x10) != state->currentFile) {
      if (0 < (long)state->fileCount) {
        lVar1 = 0;
        do {
          if (state->files[lVar1] == *(sysbvm_tuple_t *)(sourcePosition + 0x10)) {
            file = (int)lVar1 + 1;
            goto LAB_001522cc;
          }
          lVar1 = lVar1 + 1;
        } while (state->fileCount != lVar1);
      }
      file = 0;
LAB_001522cc:
      sysbvm_dwarf_debugInfo_line_setFile(&jit->dwarfDebugInfoBuilder,file);
      state->currentFile = *(sysbvm_tuple_t *)(sourcePosition + 0x10);
    }
    sysbvm_dwarf_debugInfo_line_setColumn(&jit->dwarfDebugInfoBuilder,column);
    sysbvm_dwarf_debugInfo_line_advanceLineAndPC
              (&jit->dwarfDebugInfoBuilder,line - state->previousLine,(int)pc - (int)state->pc);
    state->pc = pc;
    state->previousLine = line;
  }
  return;
}

Assistant:

void sysbvm_jit_dwarfLineInfoEmissionState_emitSourcePosition(sysbvm_bytecodeJit_t *jit, sysbvm_jit_dwarfLineInfoEmissionState_t *state, sysbvm_tuple_t sourcePosition, size_t pc, uint32_t line, uint32_t column)
{
    if(!sysbvm_tuple_isNonNullPointer(sourcePosition))
        return;

    sysbvm_sourcePosition_t *sourcePositionObject = (sysbvm_sourcePosition_t*)sourcePosition;

    // Set the source code.
    if(sourcePositionObject->sourceCode != state->currentFile)
    {
        sysbvm_dwarf_debugInfo_line_setFile(&jit->dwarfDebugInfoBuilder, sysbvm_jit_dwarfLineInfoEmissionState_indexOfFile(state, sourcePositionObject->sourceCode));
        state->currentFile = sourcePositionObject->sourceCode;
    }

    // Set the column.
    sysbvm_dwarf_debugInfo_line_setColumn(&jit->dwarfDebugInfoBuilder, column);

    int pcAdvance = (int)(pc - state->pc);
    int lineAdvance = line - state->previousLine;
    sysbvm_dwarf_debugInfo_line_advanceLineAndPC(&jit->dwarfDebugInfoBuilder, lineAdvance, pcAdvance);
    state->pc = pc;
    state->previousLine = line;
}